

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O0

int Pdr_ManCubeJust(Pdr_Man_t *p,int k,Pdr_Set_t *pCube)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  int local_38;
  int fCompl;
  int v;
  int i;
  Aig_Obj_t *pNode;
  Pdr_Set_t *pCube_local;
  int k_local;
  Pdr_Man_t *p_local;
  
  fCompl = 0;
  do {
    if (3 < fCompl) {
      return 0;
    }
    p->pCubeJust->nLits = 0;
    p->pCubeJust->Sign = 0;
    Aig_ManIncrementTravId(p->pAig);
    for (local_38 = 0; local_38 < pCube->nLits; local_38 = local_38 + 1) {
      if (*(int *)(&pCube->field_0x14 + (long)local_38 * 4) != -1) {
        pAVar1 = p->pAig;
        iVar2 = lit_var(*(lit *)(&pCube->field_0x14 + (long)local_38 * 4));
        pAVar4 = Saig_ManLi(pAVar1,iVar2);
        iVar2 = lit_sign(*(lit *)(&pCube->field_0x14 + (long)local_38 * 4));
        iVar3 = Aig_ObjFaninC0(pAVar4);
        pAVar1 = p->pAig;
        pAVar4 = Aig_ObjFanin0(pAVar4);
        iVar2 = Pdr_NtkFindSatAssign_rec
                          (pAVar1,pAVar4,(uint)((iVar2 != iVar3 ^ 0xffU) & 1),p->pCubeJust,fCompl);
        if (iVar2 == 0) break;
      }
    }
    if ((pCube->nLits <= local_38) && (p->pCubeJust->nLits != 0)) {
      Vec_IntSelectSort((int *)&p->pCubeJust->field_0x14,p->pCubeJust->nLits);
      iVar2 = Pdr_SetContainsSimple(p->pCubeJust,pCube);
      if ((iVar2 == 0) && (iVar2 = Pdr_ManCheckContainment(p,k,p->pCubeJust), iVar2 == 0)) {
        return 1;
      }
    }
    fCompl = fCompl + 1;
  } while( true );
}

Assistant:

int Pdr_ManCubeJust( Pdr_Man_t * p, int k, Pdr_Set_t * pCube )
{
    Aig_Obj_t * pNode;
    int i, v, fCompl;
//    return 0;
    for ( i = 0; i < 4; i++ )
    {
        // derive new assignment
        p->pCubeJust->nLits = 0;
        p->pCubeJust->Sign  = 0;
        Aig_ManIncrementTravId( p->pAig );
        for ( v = 0; v < pCube->nLits; v++ )
        {
            if ( pCube->Lits[v] == -1 )
                continue;
            pNode  = Saig_ManLi( p->pAig, lit_var(pCube->Lits[v]) );
            fCompl = lit_sign(pCube->Lits[v]) ^ Aig_ObjFaninC0(pNode);
            if ( !Pdr_NtkFindSatAssign_rec( p->pAig, Aig_ObjFanin0(pNode), !fCompl, p->pCubeJust, i ) )
                break;
        }
        if ( v < pCube->nLits )
            continue;
        // figure this out!!!
        if ( p->pCubeJust->nLits == 0 )
            continue;
        // successfully derived new assignment
        Vec_IntSelectSort( p->pCubeJust->Lits, p->pCubeJust->nLits );
        // check assignment against this cube
        if ( Pdr_SetContainsSimple( p->pCubeJust, pCube ) )
            continue;
//printf( "\n" );
//Pdr_SetPrint( stdout, pCube,        Saig_ManRegNum(p->pAig), NULL ); printf( "\n" );
//Pdr_SetPrint( stdout, p->pCubeJust, Saig_ManRegNum(p->pAig), NULL ); printf( "\n" );
        // check assignment against the clauses
        if ( Pdr_ManCheckContainment( p, k, p->pCubeJust ) )
            continue;
        // find good assignment
        return 1;
    }
    return 0;
}